

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStringConcat(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  StringConcat *pSVar1;
  bool bVar2;
  Ok local_9d;
  uint local_9c;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  StringConcat curr;
  IRBuilder *this_local;
  
  pSVar1 = (StringConcat *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  StringConcat::StringConcat(pSVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitStringConcat
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pSVar1);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_68 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  local_9c = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_9c == 0) {
    pSVar1 = Builder::makeStringConcat
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)86>.super_Expression.
                        type.id,curr.left);
    push(this,(Expression *)pSVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_9d);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStringConcat() {
  StringConcat curr;
  CHECK_ERR(visitStringConcat(&curr));
  push(builder.makeStringConcat(curr.left, curr.right));
  return Ok{};
}